

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setAutoFillBackground(QWidget *this,bool enabled)

{
  ushort uVar1;
  QWidgetPrivate *this_00;
  QWExtra *pQVar2;
  QWidgetData *pQVar3;
  undefined1 auVar4 [16];
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if ((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl == (QWExtra *)0x0) {
    QWidgetPrivate::createExtra(this_00);
  }
  pQVar2 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  uVar1 = *(ushort *)&pQVar2->field_0x7c;
  if (((uVar1 & 0x10) == 0) != enabled) {
    return;
  }
  *(ushort *)&pQVar2->field_0x7c = uVar1 & 0xffef | (ushort)enabled << 4;
  QWidgetPrivate::updateIsOpaque(this_00);
  pQVar3 = this->data;
  auVar4._4_4_ = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
  auVar4._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
  auVar4._8_8_ = 0;
  QWidgetPrivate::update<QRect>(*(QWidgetPrivate **)&this->field_0x8,(QRect)(auVar4 << 0x40));
  QWidgetPrivate::updateIsOpaque(this_00);
  return;
}

Assistant:

void QWidget::setAutoFillBackground(bool enabled)
{
    Q_D(QWidget);
    if (!d->extra)
        d->createExtra();
    if (d->extra->autoFillBackground == enabled)
        return;

    d->extra->autoFillBackground = enabled;
    d->updateIsOpaque();
    update();
    d->updateIsOpaque();
}